

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O1

void __thiscall
TwoValuesWithHashCollision_LeafLevelLinearCase_Test::TestBody
          (TwoValuesWithHashCollision_LeafLevelLinearCase_Test *this)

{
  database *db;
  test_trie *ptVar1;
  internal_node *piVar2;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  bool bVar3;
  uint generation;
  index_pointer *piVar4;
  address *val1;
  index_pointer iVar5;
  char *pcVar6;
  char *in_R9;
  pointer *__ptr;
  linear_node *this_02;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  shared_ptr<const_pstore::index::details::internal_node> level1_internal;
  AssertionResult gtest_ar__4;
  shared_ptr<const_pstore::index::details::internal_node> level2_internal;
  shared_ptr<const_pstore::index::details::internal_node> level10_internal;
  shared_ptr<const_pstore::index::details::internal_node> level9_internal;
  shared_ptr<const_pstore::index::details::internal_node> level8_internal;
  shared_ptr<const_pstore::index::details::internal_node> level7_internal;
  shared_ptr<const_pstore::index::details::internal_node> level6_internal;
  shared_ptr<const_pstore::index::details::internal_node> level5_internal;
  shared_ptr<const_pstore::index::details::internal_node> level4_internal;
  shared_ptr<const_pstore::index::details::internal_node> level3_internal;
  transaction_type t1;
  undefined1 local_438 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  undefined1 local_418 [8];
  index_pointer local_410;
  index_pointer local_408;
  undefined1 local_400 [16];
  index_pointer local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  AssertHelper local_3e0;
  undefined1 local_3d8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3c0;
  undefined1 local_3b8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3a0;
  undefined1 local_398 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_380;
  undefined1 local_378 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_360;
  undefined1 local_358 [16];
  transaction<std::unique_lock<mock_mutex>_> local_348;
  undefined1 local_310 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_228;
  undefined1 local_218 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_130;
  undefined1 local_120 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_38;
  
  db = &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.db_;
  local_438 = (undefined1  [8])
              &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture
               .field_0x10;
  _Stack_430._M_pi = _Stack_430._M_pi & 0xffffffffffffff00;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_438);
  _Stack_430._M_pi._0_1_ =
       (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )0x1;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)(local_358 + 0x10),db,
             (lock_type *)local_438);
  if ((_Stack_430._M_pi._0_1_ ==
       (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )0x1) && (local_438 != (undefined1  [8])0x0)) {
    _Stack_430._M_pi = _Stack_430._M_pi & 0xffffffffffffff00;
  }
  ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_438 = (undefined1  [8])&local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"g","");
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_120,ptVar1,(transaction_type *)(local_358 + 0x10),(string *)local_438);
  if (local_38._M_head_impl !=
      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_38,local_38._M_head_impl);
  }
  local_38._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
  }
  ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_438 = (undefined1  [8])&local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"h","");
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_218,ptVar1,(transaction_type *)(local_358 + 0x10),(string *)local_438);
  if ((_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )local_130._M_head_impl !=
      (_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_130,local_130._M_head_impl);
  }
  local_130._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
  }
  ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_438 = (undefined1  [8])&local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"i","");
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_310,ptVar1,(transaction_type *)(local_358 + 0x10),(string *)local_438);
  if ((tuple<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       )local_228._M_head_impl !=
      (_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_228,local_228._M_head_impl);
  }
  local_228._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
  }
  ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_438 = (undefined1  [8])&local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"g","");
  bVar3 = anon_unknown.dwarf_18e2c8::GenericIndexFixture::is_found
                    ((GenericIndexFixture *)this,ptVar1,(string *)local_438);
  local_418[0] = (internal)bVar3;
  local_410.internal_ = (internal_node *)0x0;
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
  }
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_400);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_400._4_4_,local_400._0_4_) + 0x10),
               "key \'g\' should be present in the index (heap)",0x2d);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_438,(internal *)local_418,
               (AssertionResult *)"this->is_found (*index_, \"g\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x496,(char *)local_438);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
    if (local_438 != (undefined1  [8])&local_428) {
      operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_400._4_4_,local_400._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_400._4_4_,local_400._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_418 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_410.internal_);
  }
  ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_438 = (undefined1  [8])&local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"h","");
  bVar3 = anon_unknown.dwarf_18e2c8::GenericIndexFixture::is_found
                    ((GenericIndexFixture *)this,ptVar1,(string *)local_438);
  local_418[0] = (internal)bVar3;
  local_410.internal_ = (internal_node *)0x0;
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
  }
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_400);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_400._4_4_,local_400._0_4_) + 0x10),
               "key \'h\' should be present in the index (heap)",0x2d);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_438,(internal *)local_418,
               (AssertionResult *)"this->is_found (*index_, \"h\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x497,(char *)local_438);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
    if (local_438 != (undefined1  [8])&local_428) {
      operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_400._4_4_,local_400._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_400._4_4_,local_400._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_418 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_410.internal_);
  }
  ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_438 = (undefined1  [8])&local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"i","");
  bVar3 = anon_unknown.dwarf_18e2c8::GenericIndexFixture::is_found
                    ((GenericIndexFixture *)this,ptVar1,(string *)local_438);
  local_418[0] = (internal)bVar3;
  local_410.internal_ = (internal_node *)0x0;
  if (local_438 != (undefined1  [8])&local_428) {
    operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
  }
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_400);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_400._4_4_,local_400._0_4_) + 0x10),
               "key \'i\' should be present in the index (heap)",0x2d);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_438,(internal *)local_418,
               (AssertionResult *)"this->is_found (*index_, \"i\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x498,(char *)local_438);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
    if (local_438 != (undefined1  [8])&local_428) {
      operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_400._4_4_,local_400._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_400._4_4_,local_400._0_4_) + 8))();
    }
  }
  iVar5 = local_410;
  if (local_410.internal_ != (internal_node *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_418 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_410.internal_);
  }
  piVar2 = (((this->super_TwoValuesWithHashCollision).index_._M_t.
             super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .
             super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
            ._M_head_impl)->root_).internal_;
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::check_is_heap_internal_node
            ((GenericIndexFixture *)piVar2,iVar5);
  piVar4 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar2 & 0xfffffffffffffffc),0);
  piVar4 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar4->internal_ & 0xfffffffffffffffc),0);
  piVar4 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar4->internal_ & 0xfffffffffffffffc),0);
  piVar4 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar4->internal_ & 0xfffffffffffffffc),0);
  piVar4 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar4->internal_ & 0xfffffffffffffffc),0);
  piVar4 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar4->internal_ & 0xfffffffffffffffc),0);
  piVar4 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar4->internal_ & 0xfffffffffffffffc),0);
  piVar4 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar4->internal_ & 0xfffffffffffffffc),0);
  piVar4 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar4->internal_ & 0xfffffffffffffffc),0);
  piVar4 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar4->internal_ & 0xfffffffffffffffc),0);
  piVar2 = piVar4->internal_;
  piVar4 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar2 & 0xfffffffffffffffc),0);
  local_418 = (undefined1  [8])
              (CONCAT71(local_418._1_7_,(char)(piVar4->addr_).a_) & 0xffffffffffffff01);
  local_410.internal_ = (internal_node *)0x0;
  if (((piVar4->addr_).a_ & 1) == 0) {
    testing::Message::Message((Message *)local_400);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_438,(internal *)local_418,
               (AssertionResult *)"(*level10_internal)[0].is_linear ()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x4a9,(char *)local_438);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
    if (local_438 != (undefined1  [8])&local_428) {
      operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_400._4_4_,local_400._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_400._4_4_,local_400._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_418 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_410.internal_);
  }
  piVar4 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)((ulong)piVar2 & 0xfffffffffffffffc),0);
  this_02 = (linear_node *)((ulong)piVar4->internal_ & 0xfffffffffffffffc);
  local_418 = (undefined1  [8])this_02->size_;
  local_400._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_438,"level11_linear->size ()","3U",(unsigned_long *)local_418,
             (uint *)local_400);
  if (local_438[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_418);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_430._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((_Alloc_hider *)&(_Stack_430._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x4ab,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_400,(Message *)local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_400);
    if ((_Type)local_418 != (_Type)0x0) {
      (**(code **)(*(long *)local_418 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_430._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_430,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_430._M_pi);
  }
  local_418 = (undefined1  [8])(this_02->size_ * 8 + 0x10);
  local_400._0_4_ = 0x28;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_438,"level11_linear->size_bytes ()","40U",(unsigned_long *)local_418,
             (uint *)local_400);
  if (local_438[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_418);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_430._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((_Alloc_hider *)&(_Stack_430._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x4ac,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_400,(Message *)local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_400);
    if ((_Type)local_418 != (_Type)0x0) {
      (**(code **)(*(long *)local_418 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_430._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_430,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_430._M_pi);
  }
  val1 = pstore::index::details::linear_node::operator[](this_02,0);
  local_418 = (undefined1  [8])0x0;
  testing::internal::CmpHelperNE<pstore::address,pstore::address>
            ((internal *)local_438,"(*level11_linear)[0]","pstore::address::null ()",val1,
             (address *)local_418);
  if (local_438[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_418);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_430._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((_Alloc_hider *)&(_Stack_430._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x4ad,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_400,(Message *)local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_400);
    if ((_Type)local_418 != (_Type)0x0) {
      (**(code **)(*(long *)local_418 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_430._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_430,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_430._M_pi);
  }
  this_00 = (this->super_TwoValuesWithHashCollision).index_._M_t.
            super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
            ._M_head_impl;
  generation = pstore::database::get_current_revision(db);
  iVar5.internal_ = (internal_node *)(local_358 + 0x10);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flush(this_00,(transaction_base *)iVar5.internal_,generation);
  piVar2 = (((this->super_TwoValuesWithHashCollision).index_._M_t.
             super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .
             super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
            ._M_head_impl)->root_).internal_;
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::check_is_store_internal_node
            ((GenericIndexFixture *)piVar2,iVar5);
  if (((ulong)piVar2 & 2) == 0) {
    pstore::index::details::internal_node::read_node
              ((internal_node *)local_418,db,
               (typed_address<pstore::index::details::internal_node>)
               ((ulong)piVar2 & 0xfffffffffffffffc));
    piVar4 = pstore::index::details::internal_node::operator[]((internal_node *)local_418,0);
    if (((ulong)piVar4->internal_ & 2) == 0) {
      pstore::index::details::internal_node::read_node
                ((internal_node *)local_400,db,
                 (typed_address<pstore::index::details::internal_node>)
                 ((ulong)piVar4->internal_ & 0xfffffffffffffffc));
      piVar4 = pstore::index::details::internal_node::operator[]
                         ((internal_node *)CONCAT44(local_400._4_4_,local_400._0_4_),0);
      if (((ulong)piVar4->internal_ & 2) == 0) {
        pstore::index::details::internal_node::read_node
                  ((internal_node *)local_3d8,db,
                   (typed_address<pstore::index::details::internal_node>)
                   ((ulong)piVar4->internal_ & 0xfffffffffffffffc));
        piVar4 = pstore::index::details::internal_node::operator[]
                           ((internal_node *)local_3d8._0_8_,0);
        if (((ulong)piVar4->internal_ & 2) == 0) {
          pstore::index::details::internal_node::read_node
                    ((internal_node *)local_358,db,
                     (typed_address<pstore::index::details::internal_node>)
                     ((ulong)piVar4->internal_ & 0xfffffffffffffffc));
          piVar4 = pstore::index::details::internal_node::operator[]
                             ((internal_node *)local_358._0_8_,0);
          if (((ulong)piVar4->internal_ & 2) == 0) {
            pstore::index::details::internal_node::read_node
                      ((internal_node *)(local_378 + 0x10),db,
                       (typed_address<pstore::index::details::internal_node>)
                       ((ulong)piVar4->internal_ & 0xfffffffffffffffc));
            piVar4 = pstore::index::details::internal_node::operator[]
                               ((internal_node *)local_378._16_8_,0);
            if (((ulong)piVar4->internal_ & 2) == 0) {
              pstore::index::details::internal_node::read_node
                        ((internal_node *)local_378,db,
                         (typed_address<pstore::index::details::internal_node>)
                         ((ulong)piVar4->internal_ & 0xfffffffffffffffc));
              piVar4 = pstore::index::details::internal_node::operator[]
                                 ((internal_node *)local_378._0_8_,0);
              if (((ulong)piVar4->internal_ & 2) == 0) {
                pstore::index::details::internal_node::read_node
                          ((internal_node *)(local_398 + 0x10),db,
                           (typed_address<pstore::index::details::internal_node>)
                           ((ulong)piVar4->internal_ & 0xfffffffffffffffc));
                piVar4 = pstore::index::details::internal_node::operator[]
                                   ((internal_node *)local_398._16_8_,0);
                if (((ulong)piVar4->internal_ & 2) == 0) {
                  pstore::index::details::internal_node::read_node
                            ((internal_node *)local_398,db,
                             (typed_address<pstore::index::details::internal_node>)
                             ((ulong)piVar4->internal_ & 0xfffffffffffffffc));
                  piVar4 = pstore::index::details::internal_node::operator[]
                                     ((internal_node *)local_398._0_8_,0);
                  if (((ulong)piVar4->internal_ & 2) == 0) {
                    pstore::index::details::internal_node::read_node
                              ((internal_node *)(local_3b8 + 0x10),db,
                               (typed_address<pstore::index::details::internal_node>)
                               ((ulong)piVar4->internal_ & 0xfffffffffffffffc));
                    piVar4 = pstore::index::details::internal_node::operator[]
                                       ((internal_node *)local_3b8._16_8_,0);
                    if (((ulong)piVar4->internal_ & 2) == 0) {
                      pstore::index::details::internal_node::read_node
                                ((internal_node *)local_3b8,db,
                                 (typed_address<pstore::index::details::internal_node>)
                                 ((ulong)piVar4->internal_ & 0xfffffffffffffffc));
                      piVar4 = pstore::index::details::internal_node::operator[]
                                         ((internal_node *)local_3b8._0_8_,0);
                      if (((ulong)piVar4->internal_ & 2) == 0) {
                        pstore::index::details::internal_node::read_node
                                  ((internal_node *)(local_3d8 + 0x10),db,
                                   (typed_address<pstore::index::details::internal_node>)
                                   ((ulong)piVar4->internal_ & 0xfffffffffffffffc));
                        piVar4 = pstore::index::details::internal_node::operator[]
                                           ((internal_node *)local_3d8._16_8_,0);
                        if (((ulong)piVar4->internal_ & 2) == 0) {
                          pstore::index::details::linear_node::get_node
                                    ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                                      *)local_438,db,piVar4->internal_ & 0xfffffffffffffffc);
                          this_01._M_pi = _Stack_430._M_pi;
                          _Stack_430._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                          local_438 = (undefined1  [8])0x0;
                          local_3f0 = *(index_pointer *)(local_428._M_allocated_capacity + 8);
                          local_408.addr_.a_._0_4_ = 3;
                          testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                                    ((internal *)local_438,"level11_linear->size ()","3U",
                                     (unsigned_long *)&local_3f0,(uint *)(local_418 + 0x10));
                          if (local_438[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_3f0.addr_);
                            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )_Stack_430._M_pi ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar6 = "";
                            }
                            else {
                              pcVar6 = ((_Alloc_hider *)&(_Stack_430._M_pi)->_vptr__Sp_counted_base)
                                       ->_M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)(local_418 + 0x10),kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
                                       ,0x4dc,pcVar6);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)(local_418 + 0x10),
                                       (Message *)&local_3f0.addr_);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)(local_418 + 0x10));
                            if (local_3f0.internal_ != (internal_node *)0x0) {
                              (**(code **)(*(long *)((local_3f0.internal_)->signature_)._M_elems + 8
                                          ))();
                            }
                          }
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              _Stack_430._M_pi !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&_Stack_430,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)_Stack_430._M_pi);
                          }
                          ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
                                   super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   .
                                   super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
                                   ._M_head_impl;
                          local_438 = (undefined1  [8])&local_428;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_438,"g","");
                          bVar3 = anon_unknown.dwarf_18e2c8::GenericIndexFixture::is_found
                                            ((GenericIndexFixture *)this,ptVar1,(string *)local_438)
                          ;
                          local_3f0.addr_.a_._0_1_ = bVar3;
                          local_3e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0;
                          if (local_438 != (undefined1  [8])&local_428) {
                            operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
                          }
                          if (local_3f0.addr_.a_._0_1_ == '\0') {
                            testing::Message::Message((Message *)(local_418 + 0x10));
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)
                                       (CONCAT44(local_408.addr_.a_._4_4_,local_408.addr_.a_._0_4_)
                                       + 0x10),"key \'g\' should be present in the index (store)",
                                       0x2e);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_438,(internal *)&local_3f0.addr_,
                                       (AssertionResult *)"this->is_found (*index_, \"g\")","false",
                                       "true",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_3e0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
                                       ,0x4dd,(char *)local_438);
                            testing::internal::AssertHelper::operator=
                                      (&local_3e0,(Message *)(local_418 + 0x10));
                            testing::internal::AssertHelper::~AssertHelper(&local_3e0);
                            if (local_438 != (undefined1  [8])&local_428) {
                              operator_delete((void *)local_438,local_428._M_allocated_capacity + 1)
                              ;
                            }
                            if ((long *)CONCAT44(local_408.addr_.a_._4_4_,local_408.addr_.a_._0_4_)
                                != (long *)0x0) {
                              (**(code **)(*(long *)CONCAT44(local_408.addr_.a_._4_4_,
                                                             local_408.addr_.a_._0_4_) + 8))();
                            }
                          }
                          if (local_3e8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_3e8,local_3e8);
                          }
                          ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
                                   super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   .
                                   super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
                                   ._M_head_impl;
                          local_438 = (undefined1  [8])&local_428;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_438,"h","");
                          bVar3 = anon_unknown.dwarf_18e2c8::GenericIndexFixture::is_found
                                            ((GenericIndexFixture *)this,ptVar1,(string *)local_438)
                          ;
                          local_3f0.addr_.a_._0_1_ = bVar3;
                          local_3e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0;
                          if (local_438 != (undefined1  [8])&local_428) {
                            operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
                          }
                          if (local_3f0.addr_.a_._0_1_ == '\0') {
                            testing::Message::Message((Message *)(local_418 + 0x10));
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)
                                       (CONCAT44(local_408.addr_.a_._4_4_,local_408.addr_.a_._0_4_)
                                       + 0x10),"key \'h\' should be present in the index (store)",
                                       0x2e);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_438,(internal *)&local_3f0.addr_,
                                       (AssertionResult *)"this->is_found (*index_, \"h\")","false",
                                       "true",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_3e0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
                                       ,0x4df,(char *)local_438);
                            testing::internal::AssertHelper::operator=
                                      (&local_3e0,(Message *)(local_418 + 0x10));
                            testing::internal::AssertHelper::~AssertHelper(&local_3e0);
                            if (local_438 != (undefined1  [8])&local_428) {
                              operator_delete((void *)local_438,local_428._M_allocated_capacity + 1)
                              ;
                            }
                            if ((long *)CONCAT44(local_408.addr_.a_._4_4_,local_408.addr_.a_._0_4_)
                                != (long *)0x0) {
                              (**(code **)(*(long *)CONCAT44(local_408.addr_.a_._4_4_,
                                                             local_408.addr_.a_._0_4_) + 8))();
                            }
                          }
                          if (local_3e8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_3e8,local_3e8);
                          }
                          ptVar1 = (this->super_TwoValuesWithHashCollision).index_._M_t.
                                   super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   .
                                   super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
                                   ._M_head_impl;
                          local_438 = (undefined1  [8])&local_428;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_438,"i","");
                          bVar3 = anon_unknown.dwarf_18e2c8::GenericIndexFixture::is_found
                                            ((GenericIndexFixture *)this,ptVar1,(string *)local_438)
                          ;
                          local_3f0.addr_.a_._0_1_ = bVar3;
                          local_3e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0;
                          if (local_438 != (undefined1  [8])&local_428) {
                            operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
                          }
                          if (local_3f0.addr_.a_._0_1_ == '\0') {
                            testing::Message::Message((Message *)(local_418 + 0x10));
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)
                                       (CONCAT44(local_408.addr_.a_._4_4_,local_408.addr_.a_._0_4_)
                                       + 0x10),"key \'i\' should be present in the index (store)",
                                       0x2e);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_438,(internal *)&local_3f0.addr_,
                                       (AssertionResult *)"this->is_found (*index_, \"i\")","false",
                                       "true",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_3e0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
                                       ,0x4e1,(char *)local_438);
                            testing::internal::AssertHelper::operator=
                                      (&local_3e0,(Message *)(local_418 + 0x10));
                            testing::internal::AssertHelper::~AssertHelper(&local_3e0);
                            if (local_438 != (undefined1  [8])&local_428) {
                              operator_delete((void *)local_438,local_428._M_allocated_capacity + 1)
                              ;
                            }
                            if ((long *)CONCAT44(local_408.addr_.a_._4_4_,local_408.addr_.a_._0_4_)
                                != (long *)0x0) {
                              (**(code **)(*(long *)CONCAT44(local_408.addr_.a_._4_4_,
                                                             local_408.addr_.a_._0_4_) + 8))();
                            }
                          }
                          if (local_3e8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_3e8,local_3e8);
                          }
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this_01._M_pi !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      (this_01._M_pi);
                          }
                          if (local_3c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c0)
                            ;
                          }
                          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_3b8._8_8_);
                          }
                          if (local_3a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0)
                            ;
                          }
                          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._8_8_ !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_398._8_8_);
                          }
                          if (local_380 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_380)
                            ;
                          }
                          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._8_8_ !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_378._8_8_);
                          }
                          if (local_360 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_360)
                            ;
                          }
                          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._8_8_ !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_358._8_8_);
                          }
                          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._8_8_ !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_3d8._8_8_);
                          }
                          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400._8_8_ !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_400._8_8_);
                          }
                          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_410.internal_ !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_410.internal_);
                          }
                          local_348.super_transaction_base._vptr_transaction_base =
                               (_func_int **)&PTR__transaction_00271290;
                          pstore::transaction_base::rollback((transaction_base *)(local_358 + 0x10))
                          ;
                          return;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("is_address ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
}

Assistant:

TEST_F (TwoValuesWithHashCollision, LeafLevelLinearCase) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});

    //
    //              +--------+
    // root_ ->     | 000000 |       (hash bits 0-5)
    //              +--------+
    //                   |
    //                   :
    //                   |
    //                   v
    //              +--------+
    // level10 ->   |  0000  |       (hash bits 60-63)
    //              +--------+
    //                   |
    //                   v
    //            +---+---+---+
    // level11 -> | 0 | 1 | 2 |
    //            +---+---+---+
    //              |   |   |
    //              v   |   |
    //             "g"  v   |          ( 0 )
    //                 "h"  v          ( 0 )
    //                     "i"         ( 0 )

    this->insert_or_assign (*index_, t1, "g");
    this->insert_or_assign (*index_, t1, "h");
    this->insert_or_assign (*index_, t1, "i");
    EXPECT_TRUE (this->is_found (*index_, "g")) << "key 'g' should be present in the index (heap)";
    EXPECT_TRUE (this->is_found (*index_, "h")) << "key 'h' should be present in the index (heap)";
    EXPECT_TRUE (this->is_found (*index_, "i")) << "key 'i' should be present in the index (heap)";
    {
        // Check that the trie was laid out as we expected in the heap.
        index_pointer root = index_->root ();
        this->check_is_heap_internal_node (root);

        auto const root_internal = root.untag<internal_node *> ();
        auto const level1_internal = (*root_internal)[0].untag<internal_node *> ();
        auto const level2_internal = (*level1_internal)[0].untag<internal_node *> ();
        auto const level3_internal = (*level2_internal)[0].untag<internal_node *> ();
        auto const level4_internal = (*level3_internal)[0].untag<internal_node *> ();
        auto const level5_internal = (*level4_internal)[0].untag<internal_node *> ();
        auto const level6_internal = (*level5_internal)[0].untag<internal_node *> ();
        auto const level7_internal = (*level6_internal)[0].untag<internal_node *> ();
        auto const level8_internal = (*level7_internal)[0].untag<internal_node *> ();
        auto const level9_internal = (*level8_internal)[0].untag<internal_node *> ();
        auto const level10_internal = (*level9_internal)[0].untag<internal_node *> ();
        EXPECT_TRUE ((*level10_internal)[0].is_linear ());
        auto const level11_linear = (*level10_internal)[0].untag<linear_node *> ();
        EXPECT_EQ (level11_linear->size (), 3U);
        EXPECT_EQ (level11_linear->size_bytes (), 40U);
        EXPECT_NE ((*level11_linear)[0], pstore::address::null ());
        index_->flush (t1, db_.get_current_revision ());
    }
    {
        // Check that the trie was laid out as we expected in the store.
        index_pointer root = index_->root ();
        this->check_is_store_internal_node (root);

        auto const root_internal =
            internal_node::read_node (db_, root.untag_address<internal_node> ());
        auto const level1 = (*root_internal)[0];
        auto const level1_internal =
            internal_node::read_node (db_, level1.untag_address<internal_node> ());
        auto const level2 = (*level1_internal)[0];
        auto const level2_internal =
            internal_node::read_node (db_, level2.untag_address<internal_node> ());
        auto const level3 = (*level2_internal)[0];
        auto const level3_internal =
            internal_node::read_node (db_, level3.untag_address<internal_node> ());
        auto const level4 = (*level3_internal)[0];
        auto const level4_internal =
            internal_node::read_node (db_, level4.untag_address<internal_node> ());
        auto const level5 = (*level4_internal)[0];
        auto const level5_internal =
            internal_node::read_node (db_, level5.untag_address<internal_node> ());
        auto const level6 = (*level5_internal)[0];
        auto const level6_internal =
            internal_node::read_node (db_, level6.untag_address<internal_node> ());
        auto const level7 = (*level6_internal)[0];
        auto const level7_internal =
            internal_node::read_node (db_, level7.untag_address<internal_node> ());
        auto const level8 = (*level7_internal)[0];
        auto const level8_internal =
            internal_node::read_node (db_, level8.untag_address<internal_node> ());
        auto const level9 = (*level8_internal)[0];
        auto const level9_internal =
            internal_node::read_node (db_, level9.untag_address<internal_node> ());
        auto const level10 = (*level9_internal)[0];
        auto const level10_internal =
            internal_node::read_node (db_, level10.untag_address<internal_node> ());
        auto const level11 = (*level10_internal)[0];

        std::shared_ptr<linear_node const> sptr;
        linear_node const * level11_linear = nullptr;
        std::tie (sptr, level11_linear) =
            linear_node::get_node (db_, index_pointer{level11.untag_address<linear_node> ()});

        EXPECT_EQ (level11_linear->size (), 3U);
        EXPECT_TRUE (this->is_found (*index_, "g"))
            << "key 'g' should be present in the index (store)";
        EXPECT_TRUE (this->is_found (*index_, "h"))
            << "key 'h' should be present in the index (store)";
        EXPECT_TRUE (this->is_found (*index_, "i"))
            << "key 'i' should be present in the index (store)";
    }
}